

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O1

void __thiscall Fl_PostScript_Graphics_Driver::reset(Fl_PostScript_Graphics_Driver *this)

{
  this->gap_ = 1;
  this->clip_ = (Clip *)0x0;
  this->cr_ = '\0';
  this->cg_ = '\0';
  this->cb_ = '\0';
  this->linedash_[0] = '\0';
  (this->super_Fl_Graphics_Driver).font_ = 0;
  (this->super_Fl_Graphics_Driver).size_ = 0xc;
  this->linewidth_ = 0;
  this->linestyle_ = 0;
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::reset(){
  gap_=1;
  clip_=0;
  cr_=cg_=cb_=0;
  Fl_Graphics_Driver::font(FL_HELVETICA, 12);
  linewidth_=0;
  linestyle_=FL_SOLID;
  strcpy(linedash_,"");
  Clip *c=clip_;   ////just not to have memory leaks for badly writen code (forgotten clip popping)
  
  while(c){
    clip_=clip_->prev;
    delete c;
    c=clip_;
  }
  
}